

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::RelinkFailure::Run(RelinkFailure *this)

{
  GLuint GVar1;
  char *src_vs;
  char *src_fs;
  CallLogWrapper *pCVar2;
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [39];
  allocator<char> local_119;
  string local_118 [32];
  char *pcStack_f8;
  char *varyings [2];
  GLuint local_e0;
  GLuint local_dc;
  GLuint vbuf;
  GLuint vao;
  Vec4 v [4];
  string local_90 [32];
  long local_70;
  long error;
  string local_58 [32];
  string local_38 [36];
  GLuint local_14;
  RelinkFailure *pRStack_10;
  GLuint program;
  RelinkFailure *this_local;
  
  pRStack_10 = this;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])();
  src_vs = (char *)std::__cxx11::string::c_str();
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x17])(local_58);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar1 = PIQBase::CreateProgram((PIQBase *)this,src_vs,src_fs,false);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  pCVar2 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  local_14 = GVar1;
  glu::CallLogWrapper::glBindAttribLocation(pCVar2,GVar1,0,"position");
  glu::CallLogWrapper::glBindAttribLocation(pCVar2,local_14,1,"pos");
  glu::CallLogWrapper::glBindFragDataLocation(pCVar2,local_14,0,"color");
  PIQBase::LinkProgram((PIQBase *)this,local_14);
  GVar1 = local_14;
  local_70 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,"pos",(allocator<char> *)((long)v[3].m_data + 0xf));
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar1,0x92e3,local_90,1,&local_70);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)v[3].m_data + 0xf));
  pCVar2 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(pCVar2,local_14);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&vbuf,-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(v[0].m_data + 2),-1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(v[1].m_data + 2),1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(v[2].m_data + 2),1.0,-1.0,0.0,1.0);
  glu::CallLogWrapper::glGenVertexArrays(pCVar2,1,&local_dc);
  glu::CallLogWrapper::glBindVertexArray(pCVar2,local_dc);
  glu::CallLogWrapper::glGenBuffers(pCVar2,1,&local_e0);
  glu::CallLogWrapper::glBindBuffer(pCVar2,0x8892,local_e0);
  glu::CallLogWrapper::glBufferData(pCVar2,0x8892,0x40,(Vector<float,_4> *)&vbuf,0x88e4);
  glu::CallLogWrapper::glVertexAttribPointer(pCVar2,0,4,0x1406,'\0',0x10,(void *)0x0);
  glu::CallLogWrapper::glEnableVertexAttribArray(pCVar2,0);
  glu::CallLogWrapper::glDrawArrays(pCVar2,5,0,4);
  glu::CallLogWrapper::glClear(pCVar2,0x4100);
  glu::CallLogWrapper::glDisableVertexAttribArray(pCVar2,0);
  glu::CallLogWrapper::glDeleteVertexArrays(pCVar2,1,&local_dc);
  glu::CallLogWrapper::glBindBuffer(pCVar2,0x8892,0);
  glu::CallLogWrapper::glDeleteBuffers(pCVar2,1,&local_e0);
  glu::CallLogWrapper::glBindAttribLocation(pCVar2,local_14,0,"pos");
  glu::CallLogWrapper::glBindAttribLocation(pCVar2,local_14,0,"position");
  pcStack_f8 = "q";
  varyings[0] = "z";
  glu::CallLogWrapper::glTransformFeedbackVaryings(pCVar2,local_14,2,&pcStack_f8,0x8c8c);
  PIQBase::LinkProgram((PIQBase *)this,local_14);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"position",&local_119);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar1,0x92e3,local_118,0xffffffff,&local_70);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&local_70);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"pos",&local_141);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar1,0x92e3,local_140,0xffffffff,&local_70);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&local_70);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"color",&local_169);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar1,0x92e4,local_168,0xffffffff,&local_70);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&local_70);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_14);
  return local_70;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		glBindAttribLocation(program, 1, "pos");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "pos", 1, error);
		glUseProgram(program);

		tcu::Vec4 v[4] = { tcu::Vec4(-1, 1, 0, 1), tcu::Vec4(-1, -1, 0, 1), tcu::Vec4(1, 1, 0, 1),
						   tcu::Vec4(1, -1, 0, 1) };
		GLuint vao, vbuf;
		glGenVertexArrays(1, &vao);
		glBindVertexArray(vao);
		glGenBuffers(1, &vbuf);
		glBindBuffer(GL_ARRAY_BUFFER, vbuf);
		glBufferData(GL_ARRAY_BUFFER, sizeof(v), v, GL_STATIC_DRAW);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), 0);
		glEnableVertexAttribArray(0);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		glDisableVertexAttribArray(0);
		glDeleteVertexArrays(1, &vao);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glDeleteBuffers(1, &vbuf);

		glBindAttribLocation(program, 0, "pos");
		glBindAttribLocation(program, 0, "position");
		const char* varyings[2] = { "q", "z" };
		glTransformFeedbackVaryings(program, 2, varyings, GL_INTERLEAVED_ATTRIBS);
		LinkProgram(program);

		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "position", -1, error);
		ExpectError(GL_INVALID_OPERATION, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "pos", -1, error);
		ExpectError(GL_INVALID_OPERATION, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_OUTPUT, "color", -1, error);
		ExpectError(GL_INVALID_OPERATION, error);

		glDeleteProgram(program);
		return error;
	}